

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.cpp
# Opt level: O1

pointer __thiscall
stream::chunk_reader::get(chunk_reader *this,slice_reader *base,chunk *chunk,string *key)

{
  uint uVar1;
  long *plVar2;
  long *plVar3;
  EVP_PKEY_CTX *ctx;
  long lVar4;
  bool bVar5;
  iterator __tmp;
  ssize_t sVar6;
  chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *this_00;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  string *psVar10;
  string *__nbytes;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  long *plVar13;
  pointer *result;
  char magic [4];
  char salt [8];
  checksum checksum;
  hasher hasher;
  int local_2fc;
  char local_2f8 [8];
  restricted_source<stream::slice_reader> local_2f0;
  undefined1 local_2e0 [260];
  checksum local_1dc;
  hasher local_1b8;
  arc4 local_140;
  
  __nbytes = key;
  bVar5 = slice_reader::seek(base,(ulong)chunk->first_slice,chunk->offset);
  if (!bVar5) {
    psVar10 = (string *)__cxa_allocate_exception(0x20);
    local_2f0.base = (slice_reader *)local_2e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f0,"could not seek to chunk start","");
    std::ios_base::failure[abi:cxx11]::failure(psVar10);
    *(undefined ***)psVar10 = &PTR__failure_00172538;
    __cxa_throw(psVar10,&chunk_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  sVar6 = slice_reader::read(base,(int)&local_2fc,(void *)0x4,(size_t)__nbytes);
  if ((sVar6 != 4) || (local_2fc != 0x1a626c7a)) {
    psVar10 = (string *)__cxa_allocate_exception(0x20);
    local_2f0.base = (slice_reader *)local_2e0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2f0,"bad chunk magic","");
    std::ios_base::failure[abi:cxx11]::failure(psVar10);
    *(undefined ***)psVar10 = &PTR__failure_00172538;
    __cxa_throw(psVar10,&chunk_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  this_00 = (chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
             *)operator_new(0x10);
  boost::iostreams::detail::
  chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
  ::chain_base((chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
                *)this_00);
  *(chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    **)this = this_00;
  switch(chunk->compression) {
  case Stored:
    goto switchD_00148f9f_caseD_0;
  case Zlib:
    local_140.state[0] = '\x0f';
    local_140.state[1] = '\0';
    local_140.state[2] = '\0';
    local_140.state[3] = '\0';
    boost::iostreams::
    symmetric_filter<boost::iostreams::detail::zlib_decompressor_impl<std::allocator<char>_>,_std::allocator<char>_>
    ::symmetric_filter<int>
              ((symmetric_filter<boost::iostreams::detail::zlib_decompressor_impl<std::allocator<char>_>,_std::allocator<char>_>
                *)&local_2f0,0x1000,(int *)&local_140);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    ::push_impl<boost::iostreams::basic_zlib_decompressor<std::allocator<char>>>
              (this_00,(basic_zlib_decompressor<std::allocator<char>_> *)&local_2f0,0x2000,-1);
    break;
  case BZip2:
    local_140.state._0_4_ = local_140.state._0_4_ & 0xffffff00;
    boost::iostreams::
    symmetric_filter<boost::iostreams::detail::bzip2_decompressor_impl<std::allocator<char>_>,_std::allocator<char>_>
    ::symmetric_filter<bool>
              ((symmetric_filter<boost::iostreams::detail::bzip2_decompressor_impl<std::allocator<char>_>,_std::allocator<char>_>
                *)&local_2f0,0x1000,(bool *)&local_140);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    ::push_impl<boost::iostreams::basic_bzip2_decompressor<std::allocator<char>>>
              (this_00,(basic_bzip2_decompressor<std::allocator<char>_> *)&local_2f0,0x2000,-1);
    break;
  case LZMA1:
    boost::iostreams::symmetric_filter<stream::inno_lzma1_decompressor_impl,_std::allocator<char>_>
    ::symmetric_filter((symmetric_filter<stream::inno_lzma1_decompressor_impl,_std::allocator<char>_>
                        *)&local_2f0,0x1000);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    ::
    push_impl<stream::lzma_decompressor<stream::inno_lzma1_decompressor_impl,std::allocator<char>>>
              (this_00,(lzma_decompressor<stream::inno_lzma1_decompressor_impl,_std::allocator<char>_>
                        *)&local_2f0,0x2000,-1);
    break;
  case LZMA2:
    boost::iostreams::symmetric_filter<stream::inno_lzma2_decompressor_impl,_std::allocator<char>_>
    ::symmetric_filter((symmetric_filter<stream::inno_lzma2_decompressor_impl,_std::allocator<char>_>
                        *)&local_2f0,0x1000);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    ::
    push_impl<stream::lzma_decompressor<stream::inno_lzma2_decompressor_impl,std::allocator<char>>>
              (this_00,(lzma_decompressor<stream::inno_lzma2_decompressor_impl,_std::allocator<char>_>
                        *)&local_2f0,0x2000,-1);
    break;
  default:
    psVar10 = (string *)__cxa_allocate_exception(0x20);
    local_2f0.base = (slice_reader *)local_2e0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2f0,"unknown chunk compression","");
    std::ios_base::failure[abi:cxx11]::failure(psVar10);
    *(undefined ***)psVar10 = &PTR__failure_00172538;
    __cxa_throw(psVar10,&chunk_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  boost::detail::shared_count::~shared_count((shared_count *)&local_2f0.remaining);
switchD_00148f9f_caseD_0:
  uVar1 = chunk->encryption - ARC4_MD5;
  if (uVar1 < 2) {
    sVar6 = slice_reader::read(base,(int)local_2f8,(void *)0x8,(ulong)uVar1);
    if (sVar6 != 8) {
      psVar10 = (string *)__cxa_allocate_exception(0x20);
      local_2f0.base = (slice_reader *)local_2e0;
      std::__cxx11::string::_M_construct<char*>((string *)&local_2f0,"could not read chunk salt","")
      ;
      std::ios_base::failure[abi:cxx11]::failure(psVar10);
      *(undefined ***)psVar10 = &PTR__failure_00172538;
      __cxa_throw(psVar10,&chunk_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
    crypto::hasher::hasher(&local_1b8,(chunk->encryption == ARC4_SHA1) + MD5);
    crypto::hasher::update(&local_1b8,local_2f8,8);
    crypto::hasher::update(&local_1b8,(key->_M_dataplus)._M_p,key->_M_string_length);
    crypto::hasher::finalize((checksum *)(local_2e0 + 0x104),&local_1b8);
    plVar2 = *(long **)this;
    crypto::arc4::init(&local_140,(EVP_PKEY_CTX *)(local_2e0 + 0x104));
    crypto::arc4::discard(&local_140,1000);
    plVar3 = (long *)*plVar2;
    if ((*(byte *)(plVar3 + 7) & 1) != 0) {
      std::logic_error::logic_error((logic_error *)&local_2f0,"chain complete");
      boost::throw_exception<std::logic_error>((logic_error *)&local_2f0);
    }
    if ((long *)*plVar3 == plVar3) {
      plVar13 = (long *)0x0;
    }
    else {
      plVar13 = *(long **)(plVar3[1] + 0x10);
    }
    p_Var12 = (_List_node_base *)plVar3[6];
    p_Var7 = (_List_node_base *)operator_new(0x188);
    p_Var7->_M_next = (_List_node_base *)std::ifstream::~ifstream;
    p_Var7->_M_prev = (_List_node_base *)0x0;
    p_Var7[1]._M_next = (_List_node_base *)0x0;
    p_Var7[1]._M_prev = (_List_node_base *)0x0;
    p_Var7[2]._M_next = (_List_node_base *)0x0;
    p_Var7[2]._M_prev = (_List_node_base *)0x0;
    p_Var7[3]._M_next = (_List_node_base *)0x0;
    std::locale::locale((locale *)&p_Var7[3]._M_prev);
    *(undefined4 *)&p_Var7[4]._M_next = 0;
    *(undefined1 *)&p_Var7[0x15]._M_prev = 0;
    p_Var7[0x16]._M_next = (_List_node_base *)0x0;
    p_Var7[0x16]._M_prev = (_List_node_base *)0x0;
    p_Var7[0x17]._M_next = (_List_node_base *)0x0;
    p_Var7[0x17]._M_prev = (_List_node_base *)0x0;
    *(undefined4 *)&p_Var7[0x18]._M_next = 4;
    p_Var7->_M_next = (_List_node_base *)&PTR__stream_buffer_001729f0;
    memcpy(&local_2f0,&local_140,0x110);
    p_Var9 = (_List_node_base *)0x2;
    if (2 < (long)p_Var12) {
      p_Var9 = p_Var12;
    }
    p_Var11 = (_List_node_base *)0x4;
    if (p_Var12 != (_List_node_base *)0xffffffffffffffff) {
      p_Var11 = p_Var9;
    }
    p_Var7[0x17]._M_prev = p_Var11;
    p_Var12 = (_List_node_base *)(long)((int)p_Var11 + 0x2000);
    if (p_Var7[0x17]._M_next != p_Var12) {
      if ((long)p_Var12 < 0) {
        std::__throw_bad_alloc();
      }
      p_Var8 = (_List_node_base *)operator_new((ulong)p_Var12);
      p_Var9 = p_Var7[0x16]._M_prev;
      p_Var11 = p_Var7[0x17]._M_next;
      p_Var7[0x17]._M_next = p_Var12;
      p_Var7[0x16]._M_prev = p_Var8;
      if (p_Var9 != (_List_node_base *)0x0) {
        operator_delete(p_Var9,(ulong)p_Var11);
      }
    }
    (*(code *)p_Var7->_M_next[10]._M_prev)(p_Var7);
    if (*(char *)&p_Var7[0x15]._M_prev == '\x01') {
      *(undefined1 *)&p_Var7[0x15]._M_prev = 0;
    }
    memcpy(&p_Var7[4]._M_prev,&local_2f0,0x110);
    *(undefined1 *)&p_Var7[0x15]._M_prev = 1;
    *(byte *)&p_Var7[0x18]._M_next = *(byte *)&p_Var7[0x18]._M_next | 1;
    *(byte *)&p_Var7[4]._M_next = *(byte *)&p_Var7[4]._M_next & 0xf8;
    lVar4 = *plVar2;
    p_Var12 = (_List_node_base *)operator_new(0x18);
    p_Var12[1]._M_next = p_Var7;
    std::__detail::_List_node_base::_M_hook(p_Var12);
    *(long *)(lVar4 + 0x10) = *(long *)(lVar4 + 0x10) + 1;
    if (plVar13 != (long *)0x0) {
      (**(code **)(*plVar13 + 0x70))(plVar13,*(undefined8 *)(*(long *)(*plVar2 + 8) + 0x10));
    }
    if (*(long **)(*plVar2 + 0x18) != (long *)0x0) {
      (**(code **)(**(long **)(*plVar2 + 0x18) + 0x10))();
    }
  }
  else if (chunk->encryption == XChaCha20) {
    if (key->_M_string_length != 0x38) {
      psVar10 = (string *)__cxa_allocate_exception(0x20);
      local_2f0.base = (slice_reader *)local_2e0;
      std::__cxx11::string::_M_construct<char*>((string *)&local_2f0,"unexpected key size","");
      std::ios_base::failure[abi:cxx11]::failure(psVar10);
      *(undefined ***)psVar10 = &PTR__failure_00172538;
      __cxa_throw(psVar10,&chunk_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
    ctx = (EVP_PKEY_CTX *)(key->_M_dataplus)._M_p;
    local_1b8.field_1._12_8_ = *(undefined8 *)(ctx + 0x30);
    local_1b8._0_8_ = *(ulong *)(ctx + 0x20) ^ (ulong)chunk->offset;
    local_1b8.field_1._4_4_ = (undefined4)*(undefined8 *)(ctx + 0x28);
    local_1b8.field_1._8_4_ = (undefined4)((ulong)*(undefined8 *)(ctx + 0x28) >> 0x20);
    local_1b8.field_1._4_4_ = local_1b8.field_1._4_4_ ^ chunk->first_slice;
    plVar2 = *(long **)this;
    crypto::xchacha20::init((xchacha20 *)&local_140,ctx);
    plVar3 = (long *)*plVar2;
    if ((*(byte *)(plVar3 + 7) & 1) != 0) {
      std::logic_error::logic_error((logic_error *)&local_2f0,"chain complete");
      boost::throw_exception<std::logic_error>((logic_error *)&local_2f0);
    }
    if ((long *)*plVar3 == plVar3) {
      plVar13 = (long *)0x0;
    }
    else {
      plVar13 = *(long **)(plVar3[1] + 0x10);
    }
    p_Var12 = (_List_node_base *)plVar3[6];
    p_Var7 = (_List_node_base *)operator_new(0xf8);
    p_Var7->_M_next = (_List_node_base *)std::ifstream::~ifstream;
    p_Var7->_M_prev = (_List_node_base *)0x0;
    p_Var7[1]._M_next = (_List_node_base *)0x0;
    p_Var7[1]._M_prev = (_List_node_base *)0x0;
    p_Var7[2]._M_next = (_List_node_base *)0x0;
    p_Var7[2]._M_prev = (_List_node_base *)0x0;
    p_Var7[3]._M_next = (_List_node_base *)0x0;
    std::locale::locale((locale *)&p_Var7[3]._M_prev);
    *(undefined4 *)&p_Var7[4]._M_next = 0;
    *(undefined1 *)&p_Var7[0xc]._M_prev = 0;
    p_Var7[0xd]._M_next = (_List_node_base *)0x0;
    p_Var7[0xd]._M_prev = (_List_node_base *)0x0;
    p_Var7[0xe]._M_next = (_List_node_base *)0x0;
    p_Var7[0xe]._M_prev = (_List_node_base *)0x0;
    *(undefined4 *)&p_Var7[0xf]._M_next = 4;
    p_Var7->_M_next = (_List_node_base *)&PTR__stream_buffer_00172bc8;
    memcpy(&local_2f0,&local_140,0x84);
    p_Var9 = (_List_node_base *)0x2;
    if (2 < (long)p_Var12) {
      p_Var9 = p_Var12;
    }
    p_Var11 = (_List_node_base *)0x4;
    if (p_Var12 != (_List_node_base *)0xffffffffffffffff) {
      p_Var11 = p_Var9;
    }
    p_Var7[0xe]._M_prev = p_Var11;
    p_Var12 = (_List_node_base *)(long)((int)p_Var11 + 0x2000);
    if (p_Var7[0xe]._M_next != p_Var12) {
      if ((long)p_Var12 < 0) {
        std::__throw_bad_alloc();
      }
      p_Var8 = (_List_node_base *)operator_new((ulong)p_Var12);
      p_Var9 = p_Var7[0xd]._M_prev;
      p_Var11 = p_Var7[0xe]._M_next;
      p_Var7[0xe]._M_next = p_Var12;
      p_Var7[0xd]._M_prev = p_Var8;
      if (p_Var9 != (_List_node_base *)0x0) {
        operator_delete(p_Var9,(ulong)p_Var11);
      }
    }
    (*(code *)p_Var7->_M_next[10]._M_prev)(p_Var7);
    if (*(char *)&p_Var7[0xc]._M_prev == '\x01') {
      *(undefined1 *)&p_Var7[0xc]._M_prev = 0;
    }
    memcpy((void *)((long)&p_Var7[4]._M_next + 4),&local_2f0,0x84);
    *(undefined1 *)&p_Var7[0xc]._M_prev = 1;
    *(byte *)&p_Var7[0xf]._M_next = *(byte *)&p_Var7[0xf]._M_next | 1;
    *(byte *)&p_Var7[4]._M_next = *(byte *)&p_Var7[4]._M_next & 0xf8;
    lVar4 = *plVar2;
    p_Var12 = (_List_node_base *)operator_new(0x18);
    p_Var12[1]._M_next = p_Var7;
    std::__detail::_List_node_base::_M_hook(p_Var12);
    *(long *)(lVar4 + 0x10) = *(long *)(lVar4 + 0x10) + 1;
    if (plVar13 != (long *)0x0) {
      (**(code **)(*plVar13 + 0x70))(plVar13,*(undefined8 *)(*(long *)(*plVar2 + 8) + 0x10));
    }
    if (*(long **)(*plVar2 + 0x18) != (long *)0x0) {
      (**(code **)(**(long **)(*plVar2 + 0x18) + 0x10))();
    }
  }
  local_2f0.remaining = chunk->size;
  local_2f0.base = base;
  boost::iostreams::detail::
  chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  ::push_impl<stream::restricted_source<stream::slice_reader>>
            (*(chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
               **)this,&local_2f0,-1,-1);
  return (__uniq_ptr_data<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

chunk_reader::pointer chunk_reader::get(slice_reader & base, const chunk & chunk , const std::string & key) {
	
	if(!base.seek(chunk.first_slice, chunk.offset)) {
		throw chunk_error("could not seek to chunk start");
	}
	
	char magic[sizeof(chunk_id)];
	if(base.read(magic, 4) != 4 || std::memcmp(magic, chunk_id, sizeof(chunk_id)) != 0) {
		throw chunk_error("bad chunk magic");
	}
	
	pointer result(new boost::iostreams::chain<boost::iostreams::input>);
	
	switch(chunk.compression) {
		case Stored: break;
		case Zlib:   result->push(io::zlib_decompressor(), 8192); break;
		case BZip2:  result->push(io::bzip2_decompressor(), 8192); break;
	#if INNOEXTRACT_HAVE_LZMA
		case LZMA1:  result->push(inno_lzma1_decompressor(), 8192); break;
		case LZMA2:  result->push(inno_lzma2_decompressor(), 8192); break;
	#else
		case LZMA1: case LZMA2:
			throw chunk_error("LZMA decompression not supported by this "
			                  + std::string(innoextract_name) + " build");
	#endif
		default: throw chunk_error("unknown chunk compression");
	}
	
	switch(chunk.encryption) {
		case Plaintext: break;
		#if INNOEXTRACT_HAVE_DECRYPTION
		case ARC4_MD5: /* fall-through */
		case ARC4_SHA1: {
			char salt[8];
			if(base.read(salt, 8) != 8) {
				throw chunk_error("could not read chunk salt");
			}
			crypto::hasher hasher(chunk.encryption == ARC4_SHA1 ? crypto::SHA1 : crypto::MD5);
			hasher.update(salt, sizeof(salt));
			hasher.update(key.c_str(), key.length());
			crypto::checksum checksum = hasher.finalize();
			const char * salted_key = chunk.encryption == ARC4_SHA1 ? checksum.sha1 : checksum.md5;
			size_t key_length = chunk.encryption == ARC4_SHA1 ? sizeof(checksum.sha1) : sizeof(checksum.md5);
			result->push(inno_arc4_crypter(salted_key, key_length), 8192);
			break;
		}
		case XChaCha20: {
			if(key.length() != crypto::xchacha20::key_size + crypto::xchacha20::nonce_size) {
				throw chunk_error("unexpected key size");
			}
			char nonce[crypto::xchacha20::nonce_size];
			std::memcpy(nonce, key.c_str() + crypto::xchacha20::key_size, crypto::xchacha20::nonce_size);
			util::little_endian::store(util::little_endian::load<boost::uint64_t>(nonce) ^ chunk.offset, nonce);
			util::little_endian::store(util::little_endian::load<boost::uint32_t>(nonce + 8) ^ chunk.first_slice, nonce + 8);
			result->push(inno_xchacha20_crypter(key.c_str(), nonce), 8192);
			break;
		}
		#else
		default: (void)key, throw chunk_error("XChaCha20 decryption not supported in this build");
		#endif
	}
	
	result->push(restrict(base, chunk.size));
	
	return result;
}